

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# betti.h
# Opt level: O1

void __thiscall
betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
print_aggregated_results
          (betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this)

{
  ushort uVar1;
  ushort uVar2;
  int top_dimension;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  top_dimension = (int)total_top_dimension;
  if (this->aggregate_results == true) {
    uVar1 = this->min_dimension;
    uVar2 = this->max_dimension;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_58,&total_cell_count);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_70,&total_betti);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_40,&total_skipped);
    print_ordinary((ostream *)
                   &(this->
                    super_file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
                    ).outstream,(uint)uVar1,(uint)uVar2,top_dimension,&local_58,&local_70,&local_40,
                   this->approximate_computation,
                   total_cell_count.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish !=
                   total_cell_count.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start);
    if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void betti_output_t<Complex>::print_aggregated_results() {
	if (!aggregate_results) return;

	print_ordinary(file_output_t<Complex>::outstream, int(min_dimension), int(max_dimension), int(total_top_dimension),
	               total_cell_count, total_betti, total_skipped, approximate_computation, total_cell_count.size() > 0);
}